

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_fe241b::SatdTestBase<short,_int_(*)(const_short_*,_int)>::Check
          (SatdTestBase<short,_int_(*)(const_short_*,_int)> *this,int expected)

{
  bool bVar1;
  int line;
  undefined4 uVar2;
  AssertHelper *this_00;
  char *in_RDI;
  AssertionResult gtest_ar_1;
  RegisterStateCheckMMX reg_check_mmx_1;
  RegisterStateCheck reg_check_1;
  int total_simd;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  int total_ref;
  AssertHelper *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  Type in_stack_ffffffffffffff5c;
  AssertHelper *in_stack_ffffffffffffff60;
  AssertionResult local_98;
  RegisterStateCheckMMX local_82;
  undefined4 local_64;
  Message *in_stack_ffffffffffffffa8;
  AssertHelper *in_stack_ffffffffffffffb0;
  RegisterStateCheckMMX local_2e;
  int local_10;
  
  libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_2e);
  line = (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x20),*(undefined4 *)(in_RDI + 0x18))
  ;
  local_10 = line;
  libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xa516d0);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(line,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40,
             (int *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
             (int *)in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffb0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    in_stack_ffffffffffffff40 =
         testing::AssertionResult::failure_message((AssertionResult *)0xa51755);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_RDI,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff30);
    testing::Message::~Message((Message *)0xa517a9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa51814);
  libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX(&local_82);
  uVar2 = (**(code **)(in_RDI + 0x30))
                    (*(undefined8 *)(in_RDI + 0x20),*(undefined4 *)(in_RDI + 0x18));
  local_64 = uVar2;
  libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xa51848);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((char *)CONCAT44(line,in_stack_ffffffffffffff48),in_stack_ffffffffffffff40,
             (int *)CONCAT44(uVar2,in_stack_ffffffffffffff38),(int *)in_stack_ffffffffffffff30);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff60);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xa518cd)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,in_RDI,line,
               in_stack_ffffffffffffff40);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xa5191b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xa5197d);
  return;
}

Assistant:

void Check(int expected) {
    int total_ref;
    API_REGISTER_STATE_CHECK(total_ref = satd_func_ref_(src_, satd_size_));
    EXPECT_EQ(expected, total_ref);

    int total_simd;
    API_REGISTER_STATE_CHECK(total_simd = satd_func_simd_(src_, satd_size_));
    EXPECT_EQ(expected, total_simd);
  }